

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::LanguageCompilerRule
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang,string *config)

{
  pointer pcVar1;
  size_type sVar2;
  string *name;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_c8;
  undefined8 local_a8;
  undefined1 *local_a0;
  undefined1 local_98 [32];
  basic_string_view<char,_std::char_traits<char>_> local_78;
  undefined8 local_68;
  char *local_60;
  size_type local_58;
  pointer local_50;
  undefined8 local_48;
  undefined1 *local_40;
  size_type local_38;
  pointer local_30;
  
  pcVar1 = (lang->_M_dataplus)._M_p;
  sVar2 = lang->_M_string_length;
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_c8,name);
  local_68 = 0xb;
  local_60 = "_COMPILER__";
  local_58 = local_c8._M_string_length;
  local_50 = local_c8._M_dataplus._M_p;
  local_a0 = local_98;
  local_a8 = 1;
  local_98[0] = 0x5f;
  local_48 = 1;
  local_30 = (config->_M_dataplus)._M_p;
  local_38 = config->_M_string_length;
  views._M_len = 5;
  views._M_array = &local_78;
  local_78._M_len = sVar2;
  local_78._M_str = pcVar1;
  local_40 = local_a0;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::LanguageCompilerRule(
  const std::string& lang, const std::string& config) const
{
  return cmStrCat(
    lang, "_COMPILER__",
    cmGlobalNinjaGenerator::EncodeRuleName(this->GeneratorTarget->GetName()),
    '_', config);
}